

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O2

void __thiscall
QMimeXMLProvider::QMimeXMLProvider
          (QMimeXMLProvider *this,QMimeDatabasePrivate *db,InternalDatabaseEnum param_2)

{
  Data *data;
  qsizetype len;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  internalMimeFileName();
  QMimeProviderBase::QMimeProviderBase(&this->super_QMimeProviderBase,db,(QString *)&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  (this->super_QMimeProviderBase)._vptr_QMimeProviderBase =
       (_func_int **)&PTR__QMimeXMLProvider_0066dae0;
  (this->m_nameMimeTypeMap).d = (Data *)0x0;
  (this->m_aliases).d = (Data *)0x0;
  (this->m_parents).d = (Data *)0x0;
  (this->m_mimeTypeGlobs).m_fastPatterns.d = (Data *)0x0;
  (this->m_mimeTypeGlobs).m_highWeightGlobs.super_QList<QMimeGlobPattern>.d.d = (Data *)0x0;
  (this->m_mimeTypeGlobs).m_highWeightGlobs.super_QList<QMimeGlobPattern>.d.ptr =
       (QMimeGlobPattern *)0x0;
  (this->m_mimeTypeGlobs).m_highWeightGlobs.super_QList<QMimeGlobPattern>.d.size = 0;
  (this->m_mimeTypeGlobs).m_lowWeightGlobs.super_QList<QMimeGlobPattern>.d.d = (Data *)0x0;
  (this->m_mimeTypeGlobs).m_lowWeightGlobs.super_QList<QMimeGlobPattern>.d.ptr =
       (QMimeGlobPattern *)0x0;
  (this->m_mimeTypeGlobs).m_lowWeightGlobs.super_QList<QMimeGlobPattern>.d.size = 0;
  (this->m_magicMatchers).d.d = (Data *)0x0;
  (this->m_magicMatchers).d.ptr = (QMimeMagicRuleMatcher *)0x0;
  (this->m_magicMatchers).d.size = 0;
  (this->m_allFiles).d.d = (Data *)0x0;
  (this->m_allFiles).d.ptr = (QString *)0x0;
  (this->m_allFiles).d.size = 0;
  data = (Data *)operator_new__(0x4a3d4);
  local_50.d = data;
  len = ZSTD_decompress(data,0x4a3d4,mimetype_database,0xa7f3);
  load(this,(char *)data,len);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMimeXMLProvider::QMimeXMLProvider(QMimeDatabasePrivate *db, InternalDatabaseEnum)
    : QMimeProviderBase(db, internalMimeFileName())
{
    static_assert(sizeof(mimetype_database), "Bundled MIME database is empty");
    static_assert(sizeof(mimetype_database) <= MimeTypeDatabaseOriginalSize,
                      "Compressed MIME database is larger than the original size");
    static_assert(MimeTypeDatabaseOriginalSize <= 16*1024*1024,
                      "Bundled MIME database is too big");
    const char *data = reinterpret_cast<const char *>(mimetype_database);
    qsizetype size = MimeTypeDatabaseOriginalSize;

#ifdef MIME_DATABASE_IS_ZSTD
    // uncompress with libzstd
    std::unique_ptr<char []> uncompressed(new char[size]);
    size = ZSTD_decompress(uncompressed.get(), size, mimetype_database, sizeof(mimetype_database));
    Q_ASSERT(!ZSTD_isError(size));
    data = uncompressed.get();
#elif defined(MIME_DATABASE_IS_GZIP)
    std::unique_ptr<char []> uncompressed(new char[size]);
    z_stream zs = {};
    zs.next_in = const_cast<Bytef *>(mimetype_database);
    zs.avail_in = sizeof(mimetype_database);
    zs.next_out = reinterpret_cast<Bytef *>(uncompressed.get());
    zs.avail_out = size;

    int res = inflateInit2(&zs, MAX_WBITS | 32);
    Q_ASSERT(res == Z_OK);
    res = inflate(&zs, Z_FINISH);
    Q_ASSERT(res == Z_STREAM_END);
    res = inflateEnd(&zs);
    Q_ASSERT(res == Z_OK);

    data = uncompressed.get();
    size = zs.total_out;
#endif

    load(data, size);
}